

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,signed_char>
          (BaseAppender *this,Vector *col,float input)

{
  char cVar1;
  char *pcVar2;
  idx_t iVar3;
  long in_RDI;
  float unaff_retaddr;
  
  cVar1 = Cast::Operation<float,signed_char>(unaff_retaddr);
  pcVar2 = FlatVector::GetData<signed_char>((Vector *)0x946cb7);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  pcVar2[iVar3] = cVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}